

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryEmitGeometryShaderTests.cpp
# Opt level: O3

TestCaseGroup * vkt::geometry::createEmitGeometryShaderTests(TestContext *testCtx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  long *plVar4;
  undefined8 *puVar5;
  TestNode *node;
  ulong *puVar6;
  long *plVar7;
  ulong uVar8;
  long lVar9;
  string *this;
  ostringstream s;
  ulong *local_aa8;
  long local_aa0;
  ulong local_a98;
  long lStack_a90;
  ulong *local_a88;
  long local_a80;
  ulong local_a78;
  long lStack_a70;
  ulong *local_a68;
  long local_a60;
  ulong local_a58;
  long lStack_a50;
  long *local_a48;
  long local_a40;
  long local_a38;
  long lStack_a30;
  ulong *local_a28;
  long local_a20;
  ulong local_a18;
  long lStack_a10;
  ulong *local_a08;
  long local_a00;
  ulong local_9f8 [2];
  ulong *local_9e8;
  long local_9e0;
  ulong local_9d8 [2];
  TestNode *local_9c8;
  ulong *local_9c0;
  long local_9b8;
  ulong local_9b0 [2];
  TestContext *local_9a0;
  string *local_998;
  ostringstream local_990 [112];
  ios_base local_920 [264];
  undefined8 local_818;
  undefined8 uStack_810;
  undefined4 local_808;
  undefined1 *local_800 [2];
  undefined1 local_7f0 [16];
  undefined1 *local_7e0 [2];
  undefined1 local_7d0 [16];
  undefined4 local_7c0;
  undefined4 uStack_7bc;
  undefined4 uStack_7b8;
  undefined4 uStack_7b4;
  undefined4 local_7b0;
  undefined1 *local_7a8 [2];
  undefined1 local_798 [16];
  undefined1 *local_788 [2];
  undefined1 local_778 [16];
  undefined4 local_768;
  undefined4 uStack_764;
  undefined4 uStack_760;
  undefined4 uStack_75c;
  undefined4 local_758;
  undefined1 *local_750 [2];
  undefined1 local_740 [16];
  undefined1 *local_730 [2];
  undefined1 local_720 [16];
  undefined4 local_710;
  undefined4 uStack_70c;
  undefined4 uStack_708;
  undefined4 uStack_704;
  undefined4 local_700;
  undefined1 *local_6f8 [2];
  undefined1 local_6e8 [16];
  undefined1 *local_6d8 [2];
  undefined1 local_6c8 [16];
  undefined4 local_6b8;
  undefined4 uStack_6b4;
  undefined4 uStack_6b0;
  undefined4 uStack_6ac;
  undefined4 local_6a8;
  undefined1 *local_6a0 [2];
  undefined1 local_690 [16];
  undefined1 *local_680 [2];
  undefined1 local_670 [16];
  undefined4 local_660;
  undefined8 local_65c;
  undefined8 uStack_654;
  undefined1 *local_648 [2];
  undefined1 local_638 [16];
  undefined1 *local_628 [2];
  undefined1 local_618 [16];
  undefined4 local_608;
  undefined4 uStack_604;
  undefined4 uStack_600;
  undefined4 uStack_5fc;
  undefined4 local_5f8;
  undefined1 *local_5f0 [2];
  undefined1 local_5e0 [16];
  undefined1 *local_5d0 [2];
  undefined1 local_5c0 [16];
  undefined4 local_5b0;
  undefined4 uStack_5ac;
  undefined4 uStack_5a8;
  undefined4 uStack_5a4;
  undefined4 local_5a0;
  undefined1 *local_598 [2];
  undefined1 local_588 [16];
  undefined1 *local_578 [2];
  undefined1 local_568 [16];
  undefined4 local_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 local_548;
  undefined1 *local_540 [2];
  undefined1 local_530 [16];
  undefined1 *local_520 [2];
  undefined1 local_510 [16];
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  undefined4 local_4f0;
  undefined1 *local_4e8 [2];
  undefined1 local_4d8 [16];
  undefined1 *local_4c8 [2];
  undefined1 local_4b8 [16];
  undefined4 local_4a8;
  undefined4 uStack_4a4;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  undefined4 local_498;
  undefined1 *local_490 [2];
  undefined1 local_480 [16];
  undefined1 *local_470 [2];
  undefined1 local_460 [16];
  undefined4 local_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined4 local_440;
  undefined1 *local_438 [2];
  undefined1 local_428 [16];
  undefined1 *local_418 [2];
  undefined1 local_408 [16];
  undefined4 local_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 local_3e8;
  undefined1 *local_3e0 [2];
  undefined1 local_3d0 [16];
  undefined1 *local_3c0 [2];
  undefined1 local_3b0 [16];
  undefined4 local_3a0;
  undefined8 local_39c;
  undefined8 uStack_394;
  undefined1 *local_388 [2];
  undefined1 local_378 [16];
  undefined1 *local_368 [2];
  undefined1 local_358 [16];
  undefined4 local_348;
  undefined4 uStack_344;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  undefined4 local_338;
  undefined1 *local_330 [2];
  undefined1 local_320 [16];
  undefined1 *local_310 [2];
  undefined1 local_300 [16];
  undefined4 local_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined4 local_2e0;
  undefined1 *local_2d8 [2];
  undefined1 local_2c8 [16];
  undefined1 *local_2b8 [2];
  undefined1 local_2a8 [16];
  undefined4 local_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 local_288;
  undefined1 *local_280 [2];
  undefined1 local_270 [16];
  undefined1 *local_260 [2];
  undefined1 local_250 [16];
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 local_230;
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  undefined1 *local_208 [2];
  undefined1 local_1f8 [16];
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined4 local_1d8;
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined4 local_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined4 local_180;
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  undefined4 local_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined4 local_d0;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  local_9c8 = (TestNode *)operator_new(0x70);
  local_9a0 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_9c8,testCtx,"emit","Different emit counts.");
  local_800[0] = local_7f0;
  local_818 = 0;
  uStack_810 = 0;
  local_808 = 0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_800,"points","");
  this = (string *)local_7e0;
  local_7e0[0] = local_7d0;
  std::__cxx11::string::_M_construct<char_const*>(this,"");
  local_7c0 = 0;
  uStack_7bc = 0;
  uStack_7b8 = 1;
  uStack_7b4 = 0;
  local_7b0 = 0;
  local_7a8[0] = local_798;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"points","");
  local_788[0] = local_778;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"");
  local_768 = 0;
  uStack_764 = 1;
  uStack_760 = 1;
  uStack_75c = 0;
  local_758 = 0;
  local_750[0] = local_740;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_750,"points","");
  local_730[0] = local_720;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_730,"");
  local_710 = 0;
  uStack_70c = 0;
  uStack_708 = 2;
  uStack_704 = 0;
  local_700 = 0;
  local_6f8[0] = local_6e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,"points","");
  local_6d8[0] = local_6c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6d8,"");
  local_6b8 = 0;
  uStack_6b4 = 1;
  uStack_6b0 = 2;
  uStack_6ac = 0;
  local_6a8 = 0;
  local_6a0[0] = local_690;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a0,"points","");
  local_680[0] = local_670;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_680,"");
  local_660 = 2;
  local_648[0] = local_638;
  local_65c = 0;
  uStack_654 = 0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_648,"line_strip","");
  local_628[0] = local_618;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"");
  local_608 = 2;
  uStack_604 = 0;
  uStack_600 = 1;
  uStack_5fc = 0;
  local_5f8 = 0;
  local_5f0[0] = local_5e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"line_strip","");
  local_5d0[0] = local_5c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5d0,"");
  local_5b0 = 2;
  uStack_5ac = 1;
  uStack_5a8 = 1;
  uStack_5a4 = 0;
  local_5a0 = 0;
  local_598[0] = local_588;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_598,"line_strip","");
  local_578[0] = local_568;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"");
  local_558 = 2;
  uStack_554 = 2;
  uStack_550 = 1;
  uStack_54c = 0;
  local_548 = 0;
  local_540[0] = local_530;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"line_strip","");
  local_520[0] = local_510;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_520,"");
  local_500 = 2;
  uStack_4fc = 0;
  uStack_4f8 = 2;
  uStack_4f4 = 0;
  local_4f0 = 0;
  local_4e8[0] = local_4d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"line_strip","");
  local_4c8[0] = local_4b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"");
  local_4a8 = 2;
  uStack_4a4 = 1;
  uStack_4a0 = 2;
  uStack_49c = 0;
  local_498 = 0;
  local_490[0] = local_480;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"line_strip","");
  local_470[0] = local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"");
  local_450 = 2;
  uStack_44c = 2;
  uStack_448 = 2;
  uStack_444 = 0;
  local_440 = 0;
  local_438[0] = local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"line_strip","");
  local_418[0] = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"");
  local_3f8 = 2;
  uStack_3f4 = 2;
  uStack_3f0 = 2;
  uStack_3ec = 2;
  local_3e8 = 0;
  local_3e0[0] = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"line_strip","");
  local_3c0[0] = local_3b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"");
  local_3a0 = 4;
  local_388[0] = local_378;
  local_39c = 0;
  uStack_394 = 0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"triangle_strip","");
  local_368[0] = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"");
  local_348 = 4;
  uStack_344 = 0;
  uStack_340 = 1;
  uStack_33c = 0;
  local_338 = 0;
  local_330[0] = local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"triangle_strip","");
  local_310[0] = local_300;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"");
  local_2f0 = 4;
  uStack_2ec = 1;
  uStack_2e8 = 1;
  uStack_2e4 = 0;
  local_2e0 = 0;
  local_2d8[0] = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"triangle_strip","");
  local_2b8[0] = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"");
  local_298 = 4;
  uStack_294 = 2;
  uStack_290 = 1;
  uStack_28c = 0;
  local_288 = 0;
  local_280[0] = local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"triangle_strip","");
  local_260[0] = local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"");
  local_240 = 4;
  uStack_23c = 3;
  uStack_238 = 1;
  uStack_234 = 0;
  local_230 = 0;
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"triangle_strip","");
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"");
  local_1e8 = 4;
  uStack_1e4 = 0;
  uStack_1e0 = 2;
  uStack_1dc = 0;
  local_1d8 = 0;
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"triangle_strip","");
  local_1b0[0] = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"");
  local_190 = 4;
  uStack_18c = 1;
  uStack_188 = 2;
  uStack_184 = 0;
  local_180 = 0;
  local_178[0] = local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"triangle_strip","");
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"");
  local_138 = 4;
  uStack_134 = 2;
  uStack_130 = 2;
  uStack_12c = 0;
  local_128 = 0;
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"triangle_strip","");
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"");
  local_e0 = 4;
  uStack_dc = 3;
  uStack_d8 = 2;
  uStack_d4 = 0;
  local_d0 = 0;
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"triangle_strip","");
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
  local_88 = 4;
  uStack_84 = 3;
  uStack_80 = 2;
  uStack_7c = 3;
  local_78 = 0;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"triangle_strip","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  lVar9 = 0x17;
  do {
    local_a28 = &local_a18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a28,*(long *)(this + -0x20),
               *(long *)(this + -0x18) + *(long *)(this + -0x20));
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_a28);
    local_a88 = &local_a78;
    puVar6 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar6) {
      local_a78 = *puVar6;
      lStack_a70 = plVar4[3];
    }
    else {
      local_a78 = *puVar6;
      local_a88 = (ulong *)*plVar4;
    }
    local_a80 = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream(local_990);
    std::ostream::operator<<(local_990,*(int *)(this + -0x34));
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_990);
    std::ios_base::~ios_base(local_920);
    uVar8 = 0xf;
    if (local_a88 != &local_a78) {
      uVar8 = local_a78;
    }
    if (uVar8 < (ulong)(local_a00 + local_a80)) {
      uVar8 = 0xf;
      if (local_a08 != local_9f8) {
        uVar8 = local_9f8[0];
      }
      if (uVar8 < (ulong)(local_a00 + local_a80)) goto LAB_009dda88;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a08,0,(char *)0x0,(ulong)local_a88);
    }
    else {
LAB_009dda88:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a88,(ulong)local_a08);
    }
    local_a68 = &local_a58;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_a58 = *puVar6;
      lStack_a50 = puVar5[3];
    }
    else {
      local_a58 = *puVar6;
      local_a68 = (ulong *)*puVar5;
    }
    local_a60 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)puVar6 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_a68);
    local_aa8 = &local_a98;
    puVar6 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar6) {
      local_a98 = *puVar6;
      lStack_a90 = plVar4[3];
    }
    else {
      local_a98 = *puVar6;
      local_aa8 = (ulong *)*plVar4;
    }
    local_aa0 = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream(local_990);
    std::ostream::operator<<(local_990,*(int *)(this + -0x30));
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_990);
    std::ios_base::~ios_base(local_920);
    uVar8 = 0xf;
    if (local_aa8 != &local_a98) {
      uVar8 = local_a98;
    }
    if (uVar8 < (ulong)(local_9e0 + local_aa0)) {
      uVar8 = 0xf;
      if (local_9e8 != local_9d8) {
        uVar8 = local_9d8[0];
      }
      if (uVar8 < (ulong)(local_9e0 + local_aa0)) goto LAB_009ddbdc;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_9e8,0,(char *)0x0,(ulong)local_aa8);
    }
    else {
LAB_009ddbdc:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_aa8,(ulong)local_9e8);
    }
    local_a48 = &local_a38;
    plVar4 = puVar5 + 2;
    if ((long *)*puVar5 == plVar4) {
      local_a38 = *plVar4;
      lStack_a30 = puVar5[3];
    }
    else {
      local_a38 = *plVar4;
      local_a48 = (long *)*puVar5;
    }
    local_a40 = puVar5[1];
    *puVar5 = plVar4;
    local_998 = this + -0x20;
    puVar5[1] = 0;
    *(undefined1 *)plVar4 = 0;
    std::__cxx11::string::operator=(local_998,(string *)&local_a48);
    if (local_a48 != &local_a38) {
      operator_delete(local_a48,local_a38 + 1);
    }
    if (local_9e8 != local_9d8) {
      operator_delete(local_9e8,local_9d8[0] + 1);
    }
    if (local_aa8 != &local_a98) {
      operator_delete(local_aa8,local_a98 + 1);
    }
    if (local_a68 != &local_a58) {
      operator_delete(local_a68,local_a58 + 1);
    }
    if (local_a08 != local_9f8) {
      operator_delete(local_a08,local_9f8[0] + 1);
    }
    if (local_a88 != &local_a78) {
      operator_delete(local_a88,local_a78 + 1);
    }
    if (local_a28 != &local_a18) {
      operator_delete(local_a28,local_a18 + 1);
    }
    local_a08 = local_9f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a08,*(long *)(this + -0x20),
               *(long *)(this + -0x18) + *(long *)(this + -0x20));
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_a08);
    puVar6 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar6) {
      local_a18 = *puVar6;
      lStack_a10 = plVar4[3];
      local_a28 = &local_a18;
    }
    else {
      local_a18 = *puVar6;
      local_a28 = (ulong *)*plVar4;
    }
    local_a20 = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream(local_990);
    std::ostream::operator<<(local_990,*(int *)(this + -0x34));
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_990);
    std::ios_base::~ios_base(local_920);
    uVar8 = 0xf;
    if (local_a28 != &local_a18) {
      uVar8 = local_a18;
    }
    if (uVar8 < (ulong)(local_9e0 + local_a20)) {
      uVar8 = 0xf;
      if (local_9e8 != local_9d8) {
        uVar8 = local_9d8[0];
      }
      if (uVar8 < (ulong)(local_9e0 + local_a20)) goto LAB_009dde52;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_9e8,0,(char *)0x0,(ulong)local_a28);
    }
    else {
LAB_009dde52:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a28,(ulong)local_9e8);
    }
    local_a88 = &local_a78;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_a78 = *puVar6;
      lStack_a70 = puVar5[3];
    }
    else {
      local_a78 = *puVar6;
      local_a88 = (ulong *)*puVar5;
    }
    local_a80 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)puVar6 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_a88);
    local_a68 = &local_a58;
    puVar6 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar6) {
      local_a58 = *puVar6;
      lStack_a50 = plVar4[3];
    }
    else {
      local_a58 = *puVar6;
      local_a68 = (ulong *)*plVar4;
    }
    local_a60 = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream(local_990);
    std::ostream::operator<<(local_990,*(int *)(this + -0x30));
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_990);
    std::ios_base::~ios_base(local_920);
    uVar8 = 0xf;
    if (local_a68 != &local_a58) {
      uVar8 = local_a58;
    }
    if (uVar8 < (ulong)(local_9b8 + local_a60)) {
      uVar8 = 0xf;
      if (local_9c0 != local_9b0) {
        uVar8 = local_9b0[0];
      }
      if (uVar8 < (ulong)(local_9b8 + local_a60)) goto LAB_009ddfac;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_9c0,0,(char *)0x0,(ulong)local_a68);
    }
    else {
LAB_009ddfac:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a68,(ulong)local_9c0);
    }
    local_aa8 = &local_a98;
    puVar6 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar6) {
      local_a98 = *puVar6;
      lStack_a90 = puVar5[3];
    }
    else {
      local_a98 = *puVar6;
      local_aa8 = (ulong *)*puVar5;
    }
    local_aa0 = puVar5[1];
    *puVar5 = puVar6;
    puVar5[1] = 0;
    *(undefined1 *)puVar6 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_aa8);
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_a38 = *plVar7;
      lStack_a30 = plVar4[3];
      local_a48 = &local_a38;
    }
    else {
      local_a38 = *plVar7;
      local_a48 = (long *)*plVar4;
    }
    local_a40 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=(this,(string *)&local_a48);
    if (local_a48 != &local_a38) {
      operator_delete(local_a48,local_a38 + 1);
    }
    if (local_aa8 != &local_a98) {
      operator_delete(local_aa8,local_a98 + 1);
    }
    if (local_9c0 != local_9b0) {
      operator_delete(local_9c0,local_9b0[0] + 1);
    }
    if (local_a68 != &local_a58) {
      operator_delete(local_a68,local_a58 + 1);
    }
    if (local_a88 != &local_a78) {
      operator_delete(local_a88,local_a78 + 1);
    }
    if (local_9e8 != local_9d8) {
      operator_delete(local_9e8,local_9d8[0] + 1);
    }
    if (local_a28 != &local_a18) {
      operator_delete(local_a28,local_a18 + 1);
    }
    if (local_a08 != local_9f8) {
      operator_delete(local_a08,local_9f8[0] + 1);
    }
    if (*(int *)(this + -0x2c) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_990);
      std::ostream::operator<<(local_990,*(int *)(this + -0x2c));
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_990);
      std::ios_base::~ios_base(local_920);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_a88,0,(char *)0x0,0xb7237c);
      local_a68 = &local_a58;
      puVar6 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar6) {
        local_a58 = *puVar6;
        lStack_a50 = plVar4[3];
      }
      else {
        local_a58 = *puVar6;
        local_a68 = (ulong *)*plVar4;
      }
      local_a60 = plVar4[1];
      *plVar4 = (long)puVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_a68);
      local_aa8 = &local_a98;
      puVar6 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar6) {
        local_a98 = *puVar6;
        lStack_a90 = plVar4[3];
      }
      else {
        local_a98 = *puVar6;
        local_aa8 = (ulong *)*plVar4;
      }
      local_aa0 = plVar4[1];
      *plVar4 = (long)puVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream(local_990);
      std::ostream::operator<<(local_990,*(int *)(this + -0x28));
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_990);
      std::ios_base::~ios_base(local_920);
      uVar8 = 0xf;
      if (local_aa8 != &local_a98) {
        uVar8 = local_a98;
      }
      if (uVar8 < (ulong)(local_a20 + local_aa0)) {
        uVar8 = 0xf;
        if (local_a28 != &local_a18) {
          uVar8 = local_a18;
        }
        if (uVar8 < (ulong)(local_a20 + local_aa0)) goto LAB_009de2ff;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_a28,0,(char *)0x0,(ulong)local_aa8);
      }
      else {
LAB_009de2ff:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_aa8,(ulong)local_a28);
      }
      local_a48 = &local_a38;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_a38 = *plVar4;
        lStack_a30 = puVar5[3];
      }
      else {
        local_a38 = *plVar4;
        local_a48 = (long *)*puVar5;
      }
      local_a40 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)plVar4 = 0;
      std::__cxx11::string::_M_append((char *)local_998,(ulong)local_a48);
      if (local_a48 != &local_a38) {
        operator_delete(local_a48,local_a38 + 1);
      }
      if (local_a28 != &local_a18) {
        operator_delete(local_a28,local_a18 + 1);
      }
      if (local_aa8 != &local_a98) {
        operator_delete(local_aa8,local_a98 + 1);
      }
      if (local_a68 != &local_a58) {
        operator_delete(local_a68,local_a58 + 1);
      }
      if (local_a88 != &local_a78) {
        operator_delete(local_a88,local_a78 + 1);
      }
      std::__cxx11::ostringstream::ostringstream(local_990);
      std::ostream::operator<<(local_990,*(int *)(this + -0x2c));
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_990);
      std::ios_base::~ios_base(local_920);
      puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_a28,0,(char *)0x0,0xb72390)
      ;
      local_a88 = &local_a78;
      puVar6 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar6) {
        local_a78 = *puVar6;
        lStack_a70 = puVar5[3];
      }
      else {
        local_a78 = *puVar6;
        local_a88 = (ulong *)*puVar5;
      }
      local_a80 = puVar5[1];
      *puVar5 = puVar6;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_a88);
      local_a68 = &local_a58;
      puVar6 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar6) {
        local_a58 = *puVar6;
        lStack_a50 = plVar4[3];
      }
      else {
        local_a58 = *puVar6;
        local_a68 = (ulong *)*plVar4;
      }
      local_a60 = plVar4[1];
      *plVar4 = (long)puVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream(local_990);
      std::ostream::operator<<(local_990,*(int *)(this + -0x28));
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_990);
      std::ios_base::~ios_base(local_920);
      uVar8 = 0xf;
      if (local_a68 != &local_a58) {
        uVar8 = local_a58;
      }
      if (uVar8 < (ulong)(local_a00 + local_a60)) {
        uVar8 = 0xf;
        if (local_a08 != local_9f8) {
          uVar8 = local_9f8[0];
        }
        if (uVar8 < (ulong)(local_a00 + local_a60)) goto LAB_009de59e;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_a08,0,(char *)0x0,(ulong)local_a68);
      }
      else {
LAB_009de59e:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a68,(ulong)local_a08);
      }
      local_aa8 = &local_a98;
      puVar6 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar6) {
        local_a98 = *puVar6;
        lStack_a90 = puVar5[3];
      }
      else {
        local_a98 = *puVar6;
        local_aa8 = (ulong *)*puVar5;
      }
      local_aa0 = puVar5[1];
      *puVar5 = puVar6;
      puVar5[1] = 0;
      *(undefined1 *)puVar6 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_aa8);
      local_a48 = &local_a38;
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_a38 = *plVar7;
        lStack_a30 = plVar4[3];
      }
      else {
        local_a38 = *plVar7;
        local_a48 = (long *)*plVar4;
      }
      local_a40 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)this,(ulong)local_a48);
      if (local_a48 != &local_a38) {
        operator_delete(local_a48,local_a38 + 1);
      }
      if (local_aa8 != &local_a98) {
        operator_delete(local_aa8,local_a98 + 1);
      }
      if (local_a08 != local_9f8) {
        operator_delete(local_a08,local_9f8[0] + 1);
      }
      if (local_a68 != &local_a58) {
        operator_delete(local_a68,local_a58 + 1);
      }
      if (local_a88 != &local_a78) {
        operator_delete(local_a88,local_a78 + 1);
      }
      if (local_a28 != &local_a18) {
        operator_delete(local_a28,local_a18 + 1);
      }
    }
    node = (TestNode *)operator_new(200);
    tcu::TestCase::TestCase((TestCase *)node,local_9a0,*(char **)(this + -0x20),*(char **)this);
    node->_vptr_TestNode = (_func_int **)&PTR__EmitTest_00d4f470;
    uVar1 = *(undefined4 *)(this + -0x34);
    uVar2 = *(undefined4 *)(this + -0x30);
    uVar3 = *(undefined4 *)(this + -0x2c);
    *(undefined4 *)&node[1]._vptr_TestNode = *(undefined4 *)(this + -0x38);
    *(undefined4 *)((long)&node[1]._vptr_TestNode + 4) = uVar1;
    *(undefined4 *)&node[1].m_testCtx = uVar2;
    *(undefined4 *)((long)&node[1].m_testCtx + 4) = uVar3;
    *(undefined4 *)&node[1].m_name._M_dataplus._M_p = *(undefined4 *)(this + -0x28);
    node[1].m_name._M_string_length = (size_type)((long)&node[1].m_name.field_2 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&node[1].m_name._M_string_length,*(long *)(this + -0x20),
               *(long *)(this + -0x18) + *(long *)(this + -0x20));
    node[1].m_description._M_string_length = (size_type)((long)&node[1].m_description.field_2 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&node[1].m_description._M_string_length,*(long *)this,
               *(long *)(this + 8) + *(long *)this);
    tcu::TestNode::addChild(local_9c8,node);
    this = this + 0x58;
    lVar9 = lVar9 + -1;
    if (lVar9 == 0) {
      lVar9 = -0x7e8;
      plVar4 = local_40;
      do {
        if (plVar4 != (long *)plVar4[-2]) {
          operator_delete((long *)plVar4[-2],*plVar4 + 1);
        }
        if (plVar4 + -4 != (long *)plVar4[-6]) {
          operator_delete((long *)plVar4[-6],plVar4[-4] + 1);
        }
        plVar4 = plVar4 + -0xb;
        lVar9 = lVar9 + 0x58;
      } while (lVar9 != 0);
      return (TestCaseGroup *)local_9c8;
    }
  } while( true );
}

Assistant:

TestCaseGroup* createEmitGeometryShaderTests (TestContext& testCtx)
{
	MovePtr<TestCaseGroup> emitGroup	(new TestCaseGroup(testCtx, "emit", "Different emit counts."));

	// emit different amounts
	{
		EmitTestSpec emitTests[] =
		{
			{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,		0,	0,	0,	0,	"points"		,	""},
			{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,		0,	1,	0,	0,	"points"		,	""},
			{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,		1,	1,	0,	0,	"points"		,	""},
			{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,		0,	2,	0,	0,	"points"		,	""},
			{ VK_PRIMITIVE_TOPOLOGY_POINT_LIST,		1,	2,	0,	0,	"points"		,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		0,	0,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		0,	1,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		1,	1,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		2,	1,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		0,	2,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		1,	2,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		2,	2,	0,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		2,	2,	2,	0,	"line_strip"	,	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	0,	0,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	0,	1,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	1,	1,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	2,	1,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	3,	1,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	0,	2,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	1,	2,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	2,	2,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	3,	2,	0,	0,	"triangle_strip",	""},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	3,	2,	3,	0,	"triangle_strip",	""},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(emitTests); ++ndx)
		{
			emitTests[ndx].name = std::string(emitTests[ndx].name) + "_emit_" + de::toString(emitTests[ndx].emitCountA) + "_end_" + de::toString(emitTests[ndx].endCountA);
			emitTests[ndx].desc = std::string(emitTests[ndx].name) + " output, emit " + de::toString(emitTests[ndx].emitCountA) + " vertices, call EndPrimitive " + de::toString(emitTests[ndx].endCountA) + " times";

			if (emitTests[ndx].emitCountB)
			{
				emitTests[ndx].name += "_emit_" + de::toString(emitTests[ndx].emitCountB) + "_end_" + de::toString(emitTests[ndx].endCountB);
				emitTests[ndx].desc += ", emit " + de::toString(emitTests[ndx].emitCountB) + " vertices, call EndPrimitive " + de::toString(emitTests[ndx].endCountB) + " times";
			}

			emitGroup->addChild(new EmitTest(testCtx, emitTests[ndx]));
		}
	}

	return emitGroup.release();
}